

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

char * nlohmann::detail::to_chars<double>(char *first,char *last,double value)

{
  bool bVar1;
  undefined1 *in_RDI;
  double in_XMM0_Qa;
  int kMaxExp;
  int kMinExp;
  int decimal_exponent;
  int len;
  double in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  char *in_stack_00000060;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  undefined4 uVar3;
  double local_20;
  undefined1 *local_10;
  char *local_8;
  
  bVar1 = std::signbit(in_XMM0_Qa);
  local_20 = in_XMM0_Qa;
  local_10 = in_RDI;
  if (bVar1) {
    local_20 = -in_XMM0_Qa;
    local_10 = in_RDI + 1;
    *in_RDI = 0x2d;
  }
  if ((local_20 != 0.0) || (NAN(local_20))) {
    uVar3 = 0;
    uVar2 = 0;
    dtoa_impl::grisu2<double>
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    local_8 = dtoa_impl::format_buffer
                        ((char *)CONCAT44(uVar3,uVar2),-4,0xf,in_stack_ffffffffffffffcc,
                         in_stack_ffffffffffffffc8);
  }
  else {
    *local_10 = 0x30;
    local_10[1] = 0x2e;
    local_8 = local_10 + 3;
    local_10[2] = 0x30;
  }
  return local_8;
}

Assistant:

char* to_chars(char* first, char* last, FloatType value)
{
static_cast<void>(last); // maybe unused - fix warning
assert(std::isfinite(value));

// Use signbit(value) instead of (value < 0) since signbit works for -0.
if (std::signbit(value))
{
value = -value;
*first++ = '-';
}

if (value == 0) // +-0
{
*first++ = '0';
// Make it look like a floating-point number (#362, #378)
*first++ = '.';
*first++ = '0';
return first;
}

assert(last - first >= std::numeric_limits<FloatType>::max_digits10);

// Compute v = buffer * 10^decimal_exponent.
// The decimal digits are stored in the buffer, which needs to be interpreted
// as an unsigned decimal integer.
// len is the length of the buffer, i.e. the number of decimal digits.
int len = 0;
int decimal_exponent = 0;
dtoa_impl::grisu2(first, len, decimal_exponent, value);

assert(len <= std::numeric_limits<FloatType>::max_digits10);

// Format the buffer like printf("%.*g", prec, value)
constexpr int kMinExp = -4;
// Use digits10 here to increase compatibility with version 2.
constexpr int kMaxExp = std::numeric_limits<FloatType>::digits10;

assert(last - first >= kMaxExp + 2);
assert(last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10);
assert(last - first >= std::numeric_limits<FloatType>::max_digits10 + 6);

return dtoa_impl::format_buffer(first, len, decimal_exponent, kMinExp, kMaxExp);
}